

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RepeatedRemoveDirectory(char *dir)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  allocator local_51;
  string local_50;
  
  uVar2 = 0;
  bVar3 = true;
  while( true ) {
    std::__cxx11::string::string((string *)&local_50,dir,&local_51);
    bVar1 = cmsys::SystemTools::RemoveADirectory(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) break;
    cmsys::SystemTools::Delay(100);
    bVar3 = uVar2 < 9;
    uVar2 = uVar2 + 1;
    if (uVar2 == 10) {
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool cmSystemTools::RepeatedRemoveDirectory(const char* dir)
{
  // Windows sometimes locks files temporarily so try a few times.
  for (int i = 0; i < 10; ++i) {
    if (cmSystemTools::RemoveADirectory(dir)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }
  return false;
}